

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

void utf8_clipto(char *s,size_t n)

{
  size_t sVar1;
  bool bVar2;
  
  if (n != 0) {
    sVar1 = 0;
    bVar2 = false;
    while ((*s != '\0' && (!bVar2))) {
      sVar1 = sVar1 + 1;
      s = s + 1;
      bVar2 = sVar1 == n;
    }
  }
  *s = '\0';
  return;
}

Assistant:

void utf8_clipto(char *s, size_t n)
{
	size_t i = 0, j = 0;
	bool terminate_next = false;

	if (n == 0) {
		s[i] = 0;
		return;
	}

	while (s[i]) {
		if ((s[i] & 0xc0) != 0x80) {
			j++;
			if (terminate_next)
				break;
			if (j == n)
				terminate_next = true;
		}
		i++;
	}
	s[i] = 0;
}